

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseBuilder::deletePass(BaseBuilder *this,Pass *pass)

{
  ErrorHandler *errorHandler;
  Environment EVar1;
  long *plVar2;
  uint32_t uVar3;
  Error EVar4;
  Error err;
  char *message;
  ZoneVector<asmjit::v1_14::Pass_*> *this_00;
  ulong uVar5;
  long lVar6;
  BaseEmitter *this_01;
  ErrorHandler EStack_f8;
  undefined8 uStack_f0;
  ulong uStack_e8;
  undefined8 uStack_e0;
  char *pcStack_d8;
  char acStack_d0 [136];
  ZoneVector<asmjit::v1_14::Pass_*> *pZStack_48;
  Pass *pass_local;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar4 = 5;
  }
  else if (pass == (Pass *)0x0) {
    EVar4 = 2;
  }
  else {
    pass_local = pass;
    if (pass->_cb != (BaseBuilder *)0x0) {
      if (pass->_cb != this) {
        return 3;
      }
      this_00 = &this->_passes;
      this_01 = (BaseEmitter *)this_00;
      uVar3 = ZoneVector<asmjit::v1_14::Pass_*>::indexOf(this_00,&pass_local);
      if (uVar3 == 0xffffffff) {
        deletePass();
        if (this_01->_code == (CodeHolder *)0x0) {
          EVar4 = 5;
        }
        else if (this_01[2]._gpSignature._bits == 0) {
          EVar4 = 0;
        }
        else {
          errorHandler = this_01->_errorHandler;
          pZStack_48 = this_00;
          ErrorHandler::ErrorHandler(&EStack_f8);
          EStack_f8._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_00173080;
          uStack_e8 = 0;
          uStack_f0 = 0x20;
          uStack_e0 = 0x87;
          pcStack_d8 = acStack_d0;
          acStack_d0[0] = '\0';
          BaseEmitter::setErrorHandler(this_01,&EStack_f8);
          uVar5 = (ulong)this_01[2]._gpSignature._bits;
          err = 0;
          if (uVar5 != 0) {
            EVar1 = this_01[2]._environment;
            lVar6 = 0;
            do {
              plVar2 = *(long **)((long)EVar1 + lVar6);
              Zone::reset((Zone *)&this_01[1]._gpSignature,kSoft);
              err = (**(code **)(*plVar2 + 0x10))(plVar2,&this_01[1]._gpSignature,this_01->_logger);
              if (err != 0) goto LAB_001171a5;
              lVar6 = lVar6 + 8;
            } while (uVar5 << 3 != lVar6);
            err = 0;
          }
LAB_001171a5:
          EVar4 = 0;
          Zone::reset((Zone *)&this_01[1]._gpSignature,kSoft);
          BaseEmitter::setErrorHandler(this_01,errorHandler);
          if (err != 0) {
            message = (char *)((long)&uStack_f0 + 1);
            uVar5 = uStack_f0 & 0xff;
            if (0x1e < (uStack_f0 & 0xff)) {
              message = pcStack_d8;
              uVar5 = uStack_e8;
            }
            if (uVar5 == 0) {
              message = (char *)0x0;
            }
            EVar4 = BaseEmitter::reportError(this_01,err,message);
          }
          EStack_f8._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_00173080;
          String::reset((String *)&uStack_f0);
          ErrorHandler::~ErrorHandler(&EStack_f8);
        }
        return EVar4;
      }
      pass_local->_cb = (BaseBuilder *)0x0;
      ZoneVector<asmjit::v1_14::Pass_*>::removeAt(this_00,(ulong)uVar3);
    }
    (**pass_local->_vptr_Pass)(pass_local);
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::deletePass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (pass->_cb != nullptr) {
    if (pass->_cb != this)
      return DebugUtils::errored(kErrorInvalidState);

    uint32_t index = _passes.indexOf(pass);
    ASMJIT_ASSERT(index != Globals::kNotFound);

    pass->_cb = nullptr;
    _passes.removeAt(index);
  }

  pass->~Pass();
  return kErrorOk;
}